

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t do_ssat(CPUARMState_conflict *env,int32_t val,int shift)

{
  int iVar1;
  uint uVar2;
  uint32_t mask;
  int32_t top;
  int shift_local;
  int32_t val_local;
  CPUARMState_conflict *env_local;
  
  iVar1 = val >> ((byte)shift & 0x1f);
  uVar2 = (1 << ((byte)shift & 0x1f)) - 1;
  if (iVar1 < 1) {
    env_local._4_4_ = val;
    if (iVar1 < -1) {
      env->QF = 1;
      env_local._4_4_ = uVar2 ^ 0xffffffff;
    }
  }
  else {
    env->QF = 1;
    env_local._4_4_ = uVar2;
  }
  return env_local._4_4_;
}

Assistant:

static inline uint32_t do_ssat(CPUARMState *env, int32_t val, int shift)
{
    int32_t top;
    uint32_t mask;

    top = val >> shift;
    mask = (1u << shift) - 1;
    if (top > 0) {
        env->QF = 1;
        return mask;
    } else if (top < -1) {
        env->QF = 1;
        return ~mask;
    }
    return val;
}